

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O0

void mathCore::absorbtion_law(expression *a,expression *pow)

{
  expression *peVar1;
  bool bVar2;
  reference ppeVar3;
  _Self local_a0;
  _Base_ptr local_98;
  _Self local_90;
  _Base_ptr local_88;
  _Self local_80;
  _Rb_tree_const_iterator<expression_*> local_78;
  iterator outsiders_1;
  iterator iter_1;
  _Self local_50;
  _Base_ptr local_48;
  _Self local_40;
  _Base_ptr local_38;
  _Self local_30;
  _Rb_tree_const_iterator<expression_*> local_28;
  iterator outsiders;
  iterator iter;
  expression *pow_local;
  expression *a_local;
  
  bVar2 = is_and(a);
  if (bVar2) {
    bVar2 = is_or(pow);
    if (((bVar2) && (bVar2 = is_negated(pow), !bVar2)) && (bVar2 = is_dualed(pow), !bVar2)) {
      outsiders = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::
                  lower_bound(&pow->contents,&global_variable);
      std::_Rb_tree_const_iterator<expression_*>::_Rb_tree_const_iterator(&local_28);
      while( true ) {
        local_30._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                       (&pow->contents);
        bVar2 = std::operator!=(&outsiders,&local_30);
        if (!bVar2) break;
        ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&outsiders);
        bVar2 = is_var(*ppeVar3);
        if (bVar2) {
          ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&outsiders);
          local_38 = (_Base_ptr)
                     std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::find
                               (&a->contents,ppeVar3);
          local_28._M_node = local_38;
          local_40._M_node =
               (_Base_ptr)
               std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                         (&a->contents);
          bVar2 = std::operator==(&local_28,&local_40);
          if (bVar2) {
            local_48 = (_Base_ptr)
                       std::_Rb_tree_const_iterator<expression_*>::operator++(&outsiders,0);
          }
          local_50._M_node =
               (_Base_ptr)
               std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                         (&a->contents);
          bVar2 = std::operator!=(&local_28,&local_50);
          if (bVar2) {
            ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_28);
            peVar1 = *ppeVar3;
            ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&outsiders);
            bVar2 = same_sign(peVar1,*ppeVar3);
            if (bVar2) {
              delete_children(pow);
              trans_true(pow);
              outsiders = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::
                          end(&pow->contents);
            }
            else {
              outsiders = std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                          erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>>
                                            *)&pow->contents,outsiders._M_node);
            }
          }
        }
      }
    }
  }
  else {
    bVar2 = is_or(a);
    if (bVar2) {
      bVar2 = is_and(pow);
      if (((bVar2) && (bVar2 = is_negated(pow), !bVar2)) && (bVar2 = is_dualed(pow), !bVar2)) {
        outsiders_1 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::
                      lower_bound(&pow->contents,&global_variable);
        std::_Rb_tree_const_iterator<expression_*>::_Rb_tree_const_iterator(&local_78);
        while( true ) {
          local_80._M_node =
               (_Base_ptr)
               std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                         (&pow->contents);
          bVar2 = std::operator!=(&outsiders_1,&local_80);
          if (!bVar2) break;
          ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&outsiders_1);
          bVar2 = is_var(*ppeVar3);
          if (bVar2) {
            ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&outsiders_1);
            local_88 = (_Base_ptr)
                       std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::find
                                 (&a->contents,ppeVar3);
            local_78._M_node = local_88;
            local_90._M_node =
                 (_Base_ptr)
                 std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                           (&a->contents);
            bVar2 = std::operator==(&local_78,&local_90);
            if (bVar2) {
              local_98 = (_Base_ptr)
                         std::_Rb_tree_const_iterator<expression_*>::operator++(&outsiders_1,0);
            }
            local_a0._M_node =
                 (_Base_ptr)
                 std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                           (&a->contents);
            bVar2 = std::operator!=(&local_78,&local_a0);
            if (bVar2) {
              ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_78);
              peVar1 = *ppeVar3;
              ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&outsiders_1);
              bVar2 = same_sign(peVar1,*ppeVar3);
              if (bVar2) {
                delete_children(pow);
                trans_false(pow);
                outsiders_1 = std::
                              multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::
                              end(&pow->contents);
              }
              else {
                outsiders_1 = std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                              erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>>
                                                *)&pow->contents,outsiders_1._M_node);
              }
            }
          }
        }
      }
    }
    else {
      is_var(a);
    }
  }
  empty_expression(pow);
  return;
}

Assistant:

void mathCore::absorbtion_law(expression* a, expression* pow){
	if (is_and(a)) {
		if (is_or(pow) && !(is_negated(pow) || is_dualed(pow))) { // Needs to be a clean OR statement to POW things out of it!
			auto iter = pow->contents.lower_bound(global_variable);	// You can only pow variables
			expSet::iterator outsiders;

			while (iter != pow->contents.end()) {
				if (is_var(*iter)) { // Its guarenteed to be a variable anyway
					outsiders = a->contents.find(*iter);
					if (outsiders == a->contents.end()) {	// If we find nothing, go to the next variable
						iter++;
					}
					while(outsiders != a->contents.end()) {
						// We found something outside!
						if (same_sign(*outsiders, *iter)) {
							// Same sign, Pow just became a literal 1!
							delete_children(pow);
							trans_true(pow);
							iter = pow->contents.end();
							break;
						}
						else {
							// Different Signs -> Its irrelevant, so pow loses it!
							iter = pow->contents.erase(iter);
							break;
						}
						outsiders++;
					}
				}
			}
		}
	}
	else if (is_or(a)) {
		if (is_and(pow) && !(is_negated(pow) || is_dualed(pow))) { // Needs to be a clean AND statement to POW things out of it!
			auto iter = pow->contents.lower_bound(global_variable);	// You can only pow variables
			expSet::iterator outsiders;

			while (iter != pow->contents.end()) {
				if (is_var(*iter)) { // Its guarenteed to be a variable anyway
					outsiders = a->contents.find(*iter);
					if (outsiders == a->contents.end()) {	// If we find nothing, go to the next variable
						iter++;
					}
					while (outsiders != a->contents.end()) {
						// We found something outside!
						if (same_sign(*outsiders, *iter)) {
							// Same sign, Pow just became a literal 0!
							delete_children(pow);
							trans_false(pow);
							iter = pow->contents.end();
							break;
						}
						else {
							// Different Signs -> Its irrelevant, so pow loses it!
							iter = pow->contents.erase(iter);
							break;
						}
						outsiders++;
					}
				}
			}
		}
	}
	else if (is_var(a)) {

	}
	// You could theoretically empty pow!
	empty_expression(pow);
}